

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExceptType(BinaryWriter *this,TypeVector *except_types)

{
  Stream *stream;
  bool bVar1;
  size_type value;
  reference pTVar2;
  const_iterator cStack_30;
  Type ty;
  const_iterator __end2;
  const_iterator __begin2;
  TypeVector *__range2;
  TypeVector *except_types_local;
  BinaryWriter *this_local;
  
  stream = this->stream_;
  value = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(except_types);
  WriteU32Leb128<unsigned_long>(stream,value,"exception type count");
  __end2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(except_types);
  cStack_30 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(except_types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
             ::operator*(&__end2);
    WriteType(this->stream_,*pTVar2);
    __gnu_cxx::
    __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void BinaryWriter::WriteExceptType(const TypeVector* except_types) {
  WriteU32Leb128(stream_, except_types->size(), "exception type count");
  for (Type ty : *except_types) {
    WriteType(stream_, ty);
  }
}